

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall TPZMatrix<int>::Simetrize(TPZMatrix<int> *this)

{
  undefined4 uVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZBaseMatrix *in_RDI;
  int64_t fDim1;
  int64_t col;
  int64_t row;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  long local_18;
  long local_10;
  
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  iVar4 = TPZBaseMatrix::Cols(in_RDI);
  if (iVar3 != iVar4) {
    Error(in_stack_000001d0,in_stack_000001c8);
  }
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  for (local_10 = 0; local_18 = local_10, local_10 < iVar3; local_10 = local_10 + 1) {
    while (local_18 = local_18 + 1, local_18 < iVar3) {
      iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x22])(in_RDI,local_10,local_18);
      uVar1 = *(undefined4 *)CONCAT44(extraout_var,iVar2);
      iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x22])(in_RDI,local_18,local_10);
      *(undefined4 *)CONCAT44(extraout_var_00,iVar2) = uVar1;
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}